

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TtCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  word x;
  byte bVar1;
  int iVar2;
  word *pwVar3;
  ulong uVar4;
  ulong x_00;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (nVars < 7) {
    uVar6 = 0;
    uVar4 = (ulong)(uint)nVars;
    if (nVars < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 * 8 != uVar6; uVar6 = uVar6 + 8) {
      iVar2 = Abc_TtCountOnes(*(ulong *)((long)s_Truths6Neg + uVar6) & *pTruth);
      *pStore = iVar2;
      pStore = pStore + 1;
    }
  }
  else {
    bVar1 = (char)nVars - 6U & 0x1f;
    memset(pStore,0,(ulong)(uint)nVars * 4);
    lVar7 = (ulong)(uint)nVars - 6;
    for (uVar4 = (ulong)(uint)(0 << bVar1); (long)uVar4 < (long)(1 << bVar1); uVar4 = uVar4 + 2) {
      x = pTruth[uVar4];
      uVar6 = pTruth[uVar4 + 1];
      pwVar3 = s_Truths6Neg;
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        x_00 = (uVar6 & *pwVar3) << ((byte)(1 << ((byte)lVar5 & 0x1f)) & 0x3f) | *pwVar3 & x;
        if (x_00 != 0) {
          iVar2 = Abc_TtCountOnes(x_00);
          pStore[lVar5] = pStore[lVar5] + iVar2;
        }
        pwVar3 = pwVar3 + 1;
      }
      if (x != 0) {
        iVar2 = Abc_TtCountOnes(x);
        for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
          if (((uint)uVar4 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
            pStore[lVar5 + 6] = pStore[lVar5 + 6] + iVar2;
          }
        }
      }
      if (uVar6 != 0) {
        iVar2 = Abc_TtCountOnes(uVar6);
        for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
          if ((((uint)uVar4 | 1) >> ((uint)lVar5 & 0x1f) & 1) == 0) {
            pStore[lVar5 + 6] = pStore[lVar5 + 6] + iVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    word Temp;
    int i, k, Counter, nWords;
    if ( nVars <= 6 )
    {
        for ( i = 0; i < nVars; i++ )
            pStore[i] = Abc_TtCountOnes( pTruth[0] & s_Truths6Neg[i] );
        return;
    }
    assert( nVars > 6 );
    nWords = Abc_TtWordNum( nVars );
    memset( pStore, 0, sizeof(int) * nVars );
    for ( k = 0; k < nWords; k++ )
    {
        // count 1's for the first six variables
        for ( i = 0; i < 6; i++ )
            if ( (Temp = (pTruth[k] & s_Truths6Neg[i]) | ((pTruth[k+1] & s_Truths6Neg[i]) << (1 << i))) )
                pStore[i] += Abc_TtCountOnes( Temp );
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
        k++;
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
    } 
}